

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O2

void __thiscall
sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::BasicSignal
          (BasicSignal<void_(),_std::lock_guard<std::mutex>_> *this,
          BasicSignal<void_(),_std::lock_guard<std::mutex>_> *rhs)

{
  *(undefined8 *)&this->blocked_ = 0;
  this->_vptr_BasicSignal = (_func_int **)&PTR__BasicSignal_00167518;
  (this->entries).
  super__Vector_base<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries).
  super__Vector_base<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entries).
  super__Vector_base<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->entriesMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->entriesMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->entriesMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->entriesMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->entriesMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->blocked_)._M_base._M_i = false;
  std::mutex::lock(&this->entriesMutex);
  std::mutex::lock(&rhs->entriesMutex);
  std::
  vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
  ::operator=(&this->entries,&rhs->entries);
  LOCK();
  (this->blocked_)._M_base._M_i = (__int_type)((rhs->blocked_)._M_base._M_i & 1);
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&rhs->entriesMutex);
  pthread_mutex_unlock((pthread_mutex_t *)&this->entriesMutex);
  return;
}

Assistant:

BasicSignal(const BasicSignal &rhs) noexcept : BasicSignal()
  {
    Lock lock1(entriesMutex);
    Lock lock2(rhs.entriesMutex);
    entries = rhs.entries;

    // `atomic_bool` can't be copied, so copy value.
    blocked_ = rhs.blocked_.load();
  }